

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void * evthread_setup_global_lock_(void *lock_,uint locktype,int enable_locks)

{
  void *pvVar1;
  void *local_38;
  debug_lock *lock_1;
  debug_lock *lock;
  int enable_locks_local;
  uint locktype_local;
  void *lock__local;
  
  if ((enable_locks == 0) && (original_lock_fns_.alloc == (_func_void_ptr_uint *)0x0)) {
    if (lock_ != (void *)0x0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x178,"lock_ == NULL","evthread_setup_global_lock_");
    }
    lock__local = debug_lock_alloc(locktype);
  }
  else if ((enable_locks == 0) && (original_lock_fns_.alloc != (_func_void_ptr_uint *)0x0)) {
    if (lock_ == (void *)0x0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x17d,"lock_ != NULL","evthread_setup_global_lock_");
    }
    if ((locktype & 1) == 0) {
      (*original_lock_fns_.free)(lock_,locktype);
      lock__local = debug_lock_alloc(locktype);
    }
    else {
      lock__local = event_mm_malloc_(0x20);
      if (lock__local == (void *)0x0) {
        (*original_lock_fns_.free)(lock_,locktype);
        lock__local = (void *)0x0;
      }
      else {
        *(void **)((long)lock__local + 0x18) = lock_;
        *(uint *)((long)lock__local + 4) = locktype;
        *(undefined4 *)((long)lock__local + 0x10) = 0;
        *(undefined8 *)((long)lock__local + 8) = 0;
      }
    }
  }
  else if ((enable_locks == 0) || (evthread_lock_debugging_enabled_ != 0)) {
    local_38 = lock_;
    if (lock_ == (void *)0x0) {
      local_38 = debug_lock_alloc(locktype);
    }
    if (enable_locks == 0 || evthread_lock_debugging_enabled_ == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x196,"enable_locks && evthread_lock_debugging_enabled_",
                 "evthread_setup_global_lock_");
    }
    if (*(uint *)((long)local_38 + 4) != locktype) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x197,"lock->locktype == locktype","evthread_setup_global_lock_");
    }
    if (*(long *)((long)local_38 + 0x18) == 0) {
      pvVar1 = (*original_lock_fns_.alloc)(locktype | 1);
      *(void **)((long)local_38 + 0x18) = pvVar1;
      if (*(long *)((long)local_38 + 0x18) == 0) {
        *(undefined4 *)((long)local_38 + 0x10) = 0xffffff38;
        event_mm_free_(local_38);
        return (void *)0x0;
      }
    }
    lock__local = local_38;
  }
  else {
    if (lock_ != (void *)0x0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,400,"lock_ == NULL","evthread_setup_global_lock_");
    }
    lock__local = (*evthread_lock_fns_.alloc)(locktype);
  }
  return lock__local;
}

Assistant:

void *
evthread_setup_global_lock_(void *lock_, unsigned locktype, int enable_locks)
{
	/* there are four cases here:
	   1) we're turning on debugging; locking is not on.
	   2) we're turning on debugging; locking is on.
	   3) we're turning on locking; debugging is not on.
	   4) we're turning on locking; debugging is on. */

	if (!enable_locks && original_lock_fns_.alloc == NULL) {
		/* Case 1: allocate a debug lock. */
		EVUTIL_ASSERT(lock_ == NULL);
		return debug_lock_alloc(locktype);
	} else if (!enable_locks && original_lock_fns_.alloc != NULL) {
		/* Case 2: wrap the lock in a debug lock. */
		struct debug_lock *lock;
		EVUTIL_ASSERT(lock_ != NULL);

		if (!(locktype & EVTHREAD_LOCKTYPE_RECURSIVE)) {
			/* We can't wrap it: We need a recursive lock */
			original_lock_fns_.free(lock_, locktype);
			return debug_lock_alloc(locktype);
		}
		lock = mm_malloc(sizeof(struct debug_lock));
		if (!lock) {
			original_lock_fns_.free(lock_, locktype);
			return NULL;
		}
		lock->lock = lock_;
		lock->locktype = locktype;
		lock->count = 0;
		lock->held_by = 0;
		return lock;
	} else if (enable_locks && ! evthread_lock_debugging_enabled_) {
		/* Case 3: allocate a regular lock */
		EVUTIL_ASSERT(lock_ == NULL);
		return evthread_lock_fns_.alloc(locktype);
	} else {
		/* Case 4: Fill in a debug lock with a real lock */
		struct debug_lock *lock = lock_ ? lock_ : debug_lock_alloc(locktype);
		EVUTIL_ASSERT(enable_locks &&
		              evthread_lock_debugging_enabled_);
		EVUTIL_ASSERT(lock->locktype == locktype);
		if (!lock->lock) {
			lock->lock = original_lock_fns_.alloc(
				locktype|EVTHREAD_LOCKTYPE_RECURSIVE);
			if (!lock->lock) {
				lock->count = -200;
				mm_free(lock);
				return NULL;
			}
		}
		return lock;
	}
}